

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bluetooth_packet.c
# Opt level: O1

void btbb_print_packet(btbb_packet *pkt)

{
  uint8_t host_order;
  byte bVar1;
  int i;
  long lVar2;
  long lVar3;
  char *pcVar4;
  
  if ((pkt->flags & 0x80) != 0) {
    printf("  Type: %s\n",TYPE_NAMES_rel + *(int *)(TYPE_NAMES_rel + (ulong)pkt->packet_type * 4));
    if (0 < pkt->payload_header_length) {
      printf("  LT_ADDR: %d\n",(ulong)pkt->packet_lt_addr);
      printf("  LLID: %d\n",(ulong)pkt->payload_llid);
      printf("  flow: %d\n",(ulong)pkt->payload_flow);
      printf("  payload length: %d\n",(ulong)(uint)pkt->payload_length);
    }
    if (pkt->payload_length != 0) {
      printf("  Data: ");
      if (0 < pkt->payload_length) {
        pcVar4 = pkt->payload;
        lVar3 = 0;
        do {
          lVar2 = 0;
          bVar1 = 0;
          do {
            bVar1 = bVar1 | pcVar4[lVar2] << ((byte)lVar2 & 0x1f);
            lVar2 = lVar2 + 1;
          } while (lVar2 != 8);
          printf(" %02x",(ulong)bVar1);
          lVar3 = lVar3 + 1;
          pcVar4 = pcVar4 + 8;
        } while (lVar3 < pkt->payload_length);
      }
      putchar(10);
      return;
    }
  }
  return;
}

Assistant:

void btbb_print_packet(const btbb_packet* pkt)
{
	if (btbb_packet_get_flag(pkt, BTBB_HAS_PAYLOAD)) {
		printf("  Type: %s\n", TYPE_NAMES[pkt->packet_type]);
		if (pkt->payload_header_length > 0) {
			printf("  LT_ADDR: %d\n", pkt->packet_lt_addr);
			printf("  LLID: %d\n", pkt->payload_llid);
			printf("  flow: %d\n", pkt->payload_flow);
			printf("  payload length: %d\n", pkt->payload_length);
		}
		if (pkt->payload_length) {
			printf("  Data: ");
			int i;
			for(i=0; i<pkt->payload_length; i++)
				printf(" %02x", air_to_host8(pkt->payload + 8*i, 8));
			printf("\n");
		}
	}
}